

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::gen_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  _Map_pointer ppptVar1;
  _Elt_pointer pptVar2;
  token_base **pptVar3;
  int iVar4;
  token_base *ptVar5;
  undefined4 extraout_var;
  token_base **pptVar6;
  baseHolder *size;
  baseHolder *size_00;
  compiler_type *this_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  _func_int **pp_Var7;
  token_base **it;
  token_base **__args;
  _func_int *p_Var8;
  tree_type<cs::token_base_*> t;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  token_base *obj;
  baseHolder local_118;
  tree_type<cs::token_base*> *local_110;
  size_t local_108;
  _func_int **local_100;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_f8;
  compiler_type *local_a0;
  tree_node *local_98;
  _func_int **local_90;
  undefined1 local_88 [32];
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  _List_node_base *local_58;
  _List_node_base *p_Stack_50;
  _Elt_pointer local_48;
  _Map_pointer ppptStack_40;
  
  size_00 = &local_118;
  tree_type<cs::token_base_*>::destroy(tree->mRoot);
  tree->mRoot = (tree_node *)0x0;
  ppptVar1 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  pptVar2 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if (((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last - (long)pptVar2 >> 3) +
      ((long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppptVar1 -
                (long)(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppptVar1 == (_Map_pointer)0x0)) * 0x40 == 1) {
    ptVar5 = *pptVar2;
    local_88._0_8_ = ptVar5;
    if (ptVar5 != (token_base *)0x0) {
      iVar4 = (*ptVar5->_vptr_token_base[2])(ptVar5);
      if (iVar4 == 9) {
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
        size = (baseHolder *)0x0;
        local_110 = (tree_type<cs::token_base*> *)tree;
        local_a0 = this;
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
                  (&local_f8,0);
        pp_Var7 = ptVar5[2]._vptr_token_base;
        local_90 = ptVar5[4]._vptr_token_base;
        if (pp_Var7 != local_90) {
          local_100 = ptVar5[3]._vptr_token_base;
          local_108 = ptVar5[3].line_num;
          local_98 = (tree_node *)&PTR__token_base_00334430;
          do {
            __args = (token_base **)pp_Var7[2];
            pptVar3 = (token_base **)pp_Var7[6];
            if (__args != pptVar3) {
              pptVar6 = (token_base **)pp_Var7[4];
              p_Var8 = pp_Var7[5];
              do {
                if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  size = (baseHolder *)__args;
                  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                  _M_push_back_aux<cs::token_base*const&>
                            ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_f8,
                             __args);
                }
                else {
                  *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
                  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                __args = __args + 1;
                if (__args == pptVar6) {
                  __args = *(token_base ***)(p_Var8 + 8);
                  p_Var8 = p_Var8 + 8;
                  pptVar6 = __args + 0x40;
                }
              } while (__args != pptVar3);
            }
            local_118._vptr_baseHolder =
                 (_func_int **)token_base::operator_new((token_base *)0x18,(size_t)size);
            ((tree_node *)local_118._vptr_baseHolder)->left = (tree_node *)0x1;
            ((tree_node *)local_118._vptr_baseHolder)->root = local_98;
            *(undefined4 *)&((tree_node *)local_118._vptr_baseHolder)->right = 0xd;
            if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              size = &local_118;
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*>
                        ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_f8,
                         (token_base **)&local_118);
            }
            else {
              *local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (token_base *)local_118._vptr_baseHolder;
              local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            pp_Var7 = pp_Var7 + 10;
            if (pp_Var7 == local_100) {
              pp_Var7 = *(_func_int ***)(local_108 + 8);
              local_108 = local_108 + 8;
              local_100 = pp_Var7 + 0x3c;
            }
          } while (pp_Var7 != local_90);
        }
        this = local_a0;
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_f8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        tree = (tree_type<cs::token_base_*> *)local_110;
        local_118._vptr_baseHolder = (_func_int **)0x0;
        gen_tree(this,(tree_type<cs::token_base_*> *)&local_118,
                 (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8);
        ptVar5 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)size_00);
        iVar4 = tree_type<cs::token_base_*>::copy
                          ((EVP_PKEY_CTX *)local_118._vptr_baseHolder,(EVP_PKEY_CTX *)0x0);
        ptVar5->line_num = 1;
        ptVar5->_vptr_token_base = (_func_int **)&PTR__token_expr_00334520;
        ptVar5[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar4);
        local_88._0_8_ = ptVar5;
        tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
        tree_type<cs::token_base_*>::destroy((tree_node *)local_118._vptr_baseHolder);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  (&local_f8);
      }
    }
    tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
              ((tree_type<cs::token_base*> *)tree,tree->mRoot,(token_base **)local_88);
  }
  else {
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
              (&local_f8,0);
    this_00 = (compiler_type *)local_88;
    local_48 = (_Elt_pointer)0x0;
    ppptStack_40 = (_Map_pointer)0x0;
    local_58 = (_List_node_base *)0x0;
    p_Stack_50 = (_List_node_base *)0x0;
    local_68 = (element_type *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._16_8_ = (pointer)0x0;
    local_88._24_8_ = (_Elt_pointer)0x0;
    local_88._0_8_ = (token_base *)0x0;
    local_88._8_8_ = (pointer)0x0;
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00,0);
    split_token(this_00,raw,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8,
                (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_88);
    build_tree(this,tree,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_f8,
               (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_88);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_88);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_f8);
  }
  optimize_expression(this,tree,normal);
  return;
}

Assistant:

void compiler_type::gen_tree(tree_type<token_base *> &tree, std::deque<token_base *> &raw)
	{
		tree.clear();
		if (raw.size() == 1) {
			token_base *obj = raw.front();
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
			tree.emplace_root_left(tree.root(), obj);
		}
		else {
			std::deque<token_base *> signals, objects;
			split_token(raw, signals, objects);
			build_tree(tree, signals, objects);
		}
		optimize_expression(tree);
	}